

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppunfix5.h
# Opt level: O0

void __thiscall pointprocess::poissonprocess(pointprocess *this,double intensity)

{
  int iVar1;
  int local_24;
  double dStack_20;
  int i;
  double areaS;
  double intensity_local;
  pointprocess *this_local;
  
  dStack_20 = 1.0;
  for (local_24 = 0; local_24 < this->k; local_24 = local_24 + 1) {
    dStack_20 = this->akse[local_24] * dStack_20;
  }
  iVar1 = poisson(intensity * dStack_20);
  this->n = iVar1;
  binoprocess(this);
  return;
}

Assistant:

void pointprocess :: poissonprocess ( double intensity )
{
  double areaS = 1;
  int i;
  for ( i = 0; i < k; i++ )
    areaS *= akse[i];         // AREA/VOLUME OF OBSERVATION WINDOW S

  n = poisson(intensity*areaS); // ANT PKTER ER POISSON FORDELT
  binoprocess();
}